

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_b12_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint32_t in_stack_0000000c;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  uint32_t in_stack_0000001c;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000024;
  uint8_t *in_stack_000000a0;
  uint32_t in_stack_000000a8;
  int in_stack_000000b0;
  int in_stack_000000b8;
  blend_unit_fn in_stack_000000c0;
  
  blend_a64_mask_bn_w8n_sse4_1
            (src1,src1_stride,(uint16_t *)CONCAT44(in_stack_00000024,in_stack_00000020),
             in_stack_0000001c,(uint16_t *)CONCAT44(in_stack_00000014,in_stack_00000010),
             in_stack_0000000c,in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,
             in_stack_000000b8,in_stack_000000c0);
  return;
}

Assistant:

static void blend_a64_mask_b12_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                               src1_stride, mask, mask_stride, w, h,
                               blend_8_b12);
}